

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::SSARewriter::ReplacePhiUsersWith
          (SSARewriter *this,PhiCandidate *phi_to_remove,uint32_t repl_id)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  Instruction *this_00;
  uint32_t uVar3;
  uint32_t *arg;
  iterator iVar4;
  BasicBlock *bb;
  uint32_t *puVar5;
  _Hash_node_base *p_Var6;
  uint32_t *puVar7;
  uint32_t local_44;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  uint32_t *local_38;
  
  puVar7 = (phi_to_remove->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = (phi_to_remove->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != local_38) {
    local_40 = &(this->phi_candidates_)._M_h;
    do {
      uVar1 = *puVar7;
      local_44 = uVar1;
      iVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_40,&local_44);
      bb = IRContext::get_instr_block((this->pass_->super_Pass).context_,uVar1);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_00 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar3 = 0;
        if (this_00->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
        }
        if (uVar3 == uVar1) {
          WriteVariable(this,phi_to_remove->var_id_,bb,repl_id);
        }
        else {
          p_Var6 = (this->load_replacement_)._M_h._M_before_begin._M_nxt;
          if (p_Var6 != (_Hash_node_base *)0x0) {
            uVar1 = phi_to_remove->result_id_;
            do {
              if (*(uint32_t *)((long)&p_Var6[1]._M_nxt + 4) == uVar1) {
                *(uint32_t *)((long)&p_Var6[1]._M_nxt + 4) = repl_id;
              }
              p_Var6 = p_Var6->_M_nxt;
            } while (p_Var6 != (_Hash_node_base *)0x0);
          }
        }
      }
      else {
        puVar2 = *(uint32_t **)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                         ._M_cur + 0x28);
        for (puVar5 = *(uint32_t **)
                       ((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                              ._M_cur + 0x20); puVar5 != puVar2; puVar5 = puVar5 + 1) {
          if (*puVar5 == phi_to_remove->result_id_) {
            *puVar5 = repl_id;
          }
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_38);
  }
  return;
}

Assistant:

void SSARewriter::ReplacePhiUsersWith(const PhiCandidate& phi_to_remove,
                                      uint32_t repl_id) {
  for (uint32_t user_id : phi_to_remove.users()) {
    PhiCandidate* user_phi = GetPhiCandidate(user_id);
    BasicBlock* bb = pass_->context()->get_instr_block(user_id);
    if (user_phi) {
      // If the user is a Phi candidate, replace all arguments that refer to
      // |phi_to_remove.result_id()| with |repl_id|.
      for (uint32_t& arg : user_phi->phi_args()) {
        if (arg == phi_to_remove.result_id()) {
          arg = repl_id;
        }
      }
    } else if (bb->id() == user_id) {
      // The phi candidate is the definition of the variable at basic block
      // |bb|.  We must change this to the replacement.
      WriteVariable(phi_to_remove.var_id(), bb, repl_id);
    } else {
      // For regular loads, traverse the |load_replacement_| table looking for
      // instances of |phi_to_remove|.
      for (auto& it : load_replacement_) {
        if (it.second == phi_to_remove.result_id()) {
          it.second = repl_id;
        }
      }
    }
  }
}